

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

unique_ptr<int,_std::default_delete<int>_> __thiscall
(anonymous_namespace)::roundtrip<std::unique_ptr<int,std::default_delete<int>>>
          (_anonymous_namespace_ *this,unique_ptr<int,_std::default_delete<int>_> *in)

{
  long lVar1;
  pointer *__ptr;
  Result *in_R9;
  OutputStream ostream;
  stringstream stream;
  undefined1 auStack_1e8 [4];
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  OutputStream local_1a8;
  long local_1a0 [3];
  undefined4 auStack_184 [25];
  ios_base local_120 [264];
  
  *(undefined8 *)this = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  *(undefined4 *)((long)auStack_184 + lVar1) = 4;
  std::ios::clear((int)auStack_1e8 + (int)lVar1 + 0x48);
  local_1a8.stream = (stringstream *)local_1a0;
  mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  serialize<OutputStream>(in,&local_1a8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0 = (ulong)((in->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) * 4 + 1;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b828c,(char *)0x36,0x1b84ed,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  local_1d8.lhs = (unsigned_long)local_1a0;
  mserialize::detail::BuiltinDeserializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  deserialize<InputStream>
            ((unique_ptr<int,_std::default_delete<int>_> *)this,(InputStream *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
         (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)this;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}